

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_std_getenviron(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *__s;
  long lVar1;
  JSAtom prop;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar6;
  JSValue JVar7;
  JSValue val;
  int64_t iVar5;
  
  JVar7 = JS_NewObject(ctx);
  lVar1 = _environ;
  iVar5 = JVar7.tag;
  uVar6 = 0;
  if ((int)JVar7.tag == 6) {
    uVar4 = 0;
    iVar5 = 6;
  }
  else {
    while( true ) {
      __s = *(char **)(lVar1 + uVar6 * 8);
      if (__s == (char *)0x0) break;
      pcVar3 = strchr(__s,0x3d);
      if (pcVar3 != (char *)0x0) {
        prop = JS_NewAtomLen(ctx,__s,(long)pcVar3 - (long)__s);
        if (prop != 0) {
          val = JS_NewString(ctx,pcVar3 + 1);
          iVar2 = JS_DefinePropertyValue(ctx,JVar7,prop,val,7);
          JS_FreeAtom(ctx,prop);
          if (-1 < iVar2) goto LAB_0010e9b6;
        }
        JS_FreeValue(ctx,JVar7);
        uVar6 = 0;
        uVar4 = 0;
        iVar5 = 6;
        goto LAB_0010e9f0;
      }
LAB_0010e9b6:
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    uVar4 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
    uVar6 = (ulong)JVar7.u.ptr & 0xffffffff;
  }
LAB_0010e9f0:
  JVar7.tag = iVar5;
  JVar7.u.ptr = (void *)(uVar6 | uVar4);
  return JVar7;
}

Assistant:

static JSValue js_std_getenviron(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    char **envp;
    const char *name, *p, *value;
    JSValue obj;
    uint32_t idx;
    size_t name_len;
    JSAtom atom;
    int ret;

    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    envp = environ;
    for(idx = 0; envp[idx] != NULL; idx++) {
        name = envp[idx];
        p = strchr(name, '=');
        name_len = p - name;
        if (!p)
            continue;
        value = p + 1;
        atom = JS_NewAtomLen(ctx, name, name_len);
        if (atom == JS_ATOM_NULL)
            goto fail;
        ret = JS_DefinePropertyValue(ctx, obj, atom, JS_NewString(ctx, value),
                                     JS_PROP_C_W_E);
        JS_FreeAtom(ctx, atom);
        if (ret < 0)
            goto fail;
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}